

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O3

void __thiscall Server::process_pending_clients(Server *this)

{
  size_t *psVar1;
  uint __fd;
  uint uVar2;
  int client_sock;
  int iVar3;
  SOCK5ConnectionMaker *this_00;
  _List_node_base *p_Var4;
  runtime_error *this_01;
  socklen_t addrlen;
  sockaddr_in client_addr;
  socklen_t local_54;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  sockaddr local_30;
  
  __fd = this->listen_sockfd;
  uVar2 = __fd + 0x3f;
  if (-1 < (int)__fd) {
    uVar2 = __fd;
  }
  if (((ulong)(this->rdfds).fds_bits[(int)uVar2 >> 6] >> ((ulong)__fd & 0x3f) & 1) != 0) {
    local_54 = 0x10;
    client_sock = accept(__fd,&local_30,&local_54);
    iVar3 = this->maxfd;
    if (this->maxfd <= client_sock) {
      iVar3 = client_sock;
    }
    this->maxfd = iVar3;
    if (0x3ff < client_sock) {
      this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_50,"Socket number out of range for select","");
      std::runtime_error::runtime_error(this_01,(string *)local_50);
      __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    this_00 = (SOCK5ConnectionMaker *)operator_new(0x840);
    SOCK5ConnectionMaker::SOCK5ConnectionMaker(this_00,client_sock);
    p_Var4 = (_List_node_base *)operator_new(0x20);
    *(int *)&p_Var4[1]._M_next = client_sock;
    p_Var4[1]._M_prev = (_List_node_base *)this_00;
    std::__detail::_List_node_base::_M_hook(p_Var4);
    psVar1 = &(this->waitingForHandshake).
              super__List_base<std::pair<int,_SOCK5ConnectionMaker_*>,_std::allocator<std::pair<int,_SOCK5ConnectionMaker_*>_>_>
              ._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void Server::process_pending_clients() {
    if (FD_ISSET(listen_sockfd, &rdfds)) {
        sockaddr_in client_addr;
        socklen_t addrlen = sizeof(client_addr);
        int client_connection = accept(listen_sockfd, reinterpret_cast<sockaddr *>(&client_addr), &addrlen);
        if (!add_fd(client_connection)) {
            throw std::runtime_error(std::string("Socket number out of range for select"));
        }
        waitingForHandshake.push_back(std::pair<int, SOCK5ConnectionMaker*>(client_connection,new SOCK5ConnectionMaker(client_connection)));
    }
}